

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 fts3ChecksumEntry(char *zTerm,int nTerm,int iLangid,int iIndex,i64 iDocid,int iCol,int iPos)

{
  u64 local_38;
  u64 ret;
  int i;
  int iCol_local;
  i64 iDocid_local;
  int iIndex_local;
  int iLangid_local;
  int nTerm_local;
  char *zTerm_local;
  
  local_38 = (((iDocid * 9 + (long)iLangid) * 9 + (long)iIndex) * 9 + (long)iCol) * 9 + (long)iPos;
  for (ret._0_4_ = 0; (int)ret < nTerm; ret._0_4_ = (int)ret + 1) {
    local_38 = local_38 * 9 + (long)zTerm[(int)ret];
  }
  return local_38;
}

Assistant:

static u64 fts3ChecksumEntry(
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm,                      /* Size of zTerm in bytes */
  int iLangid,                    /* Language id for current row */
  int iIndex,                     /* Index (0..Fts3Table.nIndex-1) */
  i64 iDocid,                     /* Docid for current row. */
  int iCol,                       /* Column number */
  int iPos                        /* Position */
){
  int i;
  u64 ret = (u64)iDocid;

  ret += (ret<<3) + iLangid;
  ret += (ret<<3) + iIndex;
  ret += (ret<<3) + iCol;
  ret += (ret<<3) + iPos;
  for(i=0; i<nTerm; i++) ret += (ret<<3) + zTerm[i];

  return ret;
}